

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_date(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_c40;
  StrX local_c30;
  StrX local_c20;
  long local_c10;
  XMLCh *actRetCanRep_17;
  undefined1 local_c00 [4];
  Status myStatus_29;
  StrX local_bf0;
  StrX local_be0;
  long local_bd0;
  XMLCh *actRetCanRep_16;
  undefined1 local_bc0 [4];
  Status myStatus_28;
  StrX local_bb0;
  StrX local_ba0;
  long local_b90;
  XMLCh *actRetCanRep_15;
  undefined1 local_b80 [4];
  Status myStatus_27;
  StrX local_b70;
  char *local_b60;
  char *actRetCanRep_inchar_14;
  wchar16 *local_b48;
  XMLCh *actRetCanRep_14;
  undefined1 local_b38 [4];
  Status myStatus_26;
  StrX local_b28;
  char *local_b18;
  char *actRetCanRep_inchar_13;
  wchar16 *local_b00;
  XMLCh *actRetCanRep_13;
  undefined1 local_af0 [4];
  Status myStatus_25;
  StrX local_ae0;
  char *local_ad0;
  char *actRetCanRep_inchar_12;
  wchar16 *local_ab8;
  XMLCh *actRetCanRep_12;
  undefined1 local_aa8 [4];
  Status myStatus_24;
  StrX local_a98;
  char *local_a88;
  char *actRetCanRep_inchar_11;
  wchar16 *local_a70;
  XMLCh *actRetCanRep_11;
  undefined1 local_a60 [4];
  Status myStatus_23;
  StrX local_a50;
  char *local_a40;
  char *actRetCanRep_inchar_10;
  wchar16 *local_a28;
  XMLCh *actRetCanRep_10;
  undefined1 local_a18 [4];
  Status myStatus_22;
  StrX local_a08;
  char *local_9f8;
  char *actRetCanRep_inchar_9;
  wchar16 *local_9e0;
  XMLCh *actRetCanRep_9;
  undefined1 local_9d0 [4];
  Status myStatus_21;
  StrX local_9c0;
  char *local_9b0;
  char *actRetCanRep_inchar_8;
  wchar16 *local_998;
  XMLCh *actRetCanRep_8;
  undefined1 local_988 [4];
  Status myStatus_20;
  StrX local_978;
  char *local_968;
  char *actRetCanRep_inchar_7;
  wchar16 *local_950;
  XMLCh *actRetCanRep_7;
  undefined1 local_940 [4];
  Status myStatus_19;
  StrX local_930;
  char *local_920;
  char *actRetCanRep_inchar_6;
  wchar16 *local_908;
  XMLCh *actRetCanRep_6;
  undefined1 local_8f8 [4];
  Status myStatus_18;
  StrX local_8e8;
  char *local_8d8;
  char *actRetCanRep_inchar_5;
  wchar16 *local_8c0;
  XMLCh *actRetCanRep_5;
  undefined1 local_8b0 [4];
  Status myStatus_17;
  StrX local_8a0;
  char *local_890;
  char *actRetCanRep_inchar_4;
  wchar16 *local_878;
  XMLCh *actRetCanRep_4;
  undefined1 local_868 [4];
  Status myStatus_16;
  StrX local_858;
  char *local_848;
  char *actRetCanRep_inchar_3;
  wchar16 *local_830;
  XMLCh *actRetCanRep_3;
  undefined1 local_820 [4];
  Status myStatus_15;
  StrX local_810;
  char *local_800;
  char *actRetCanRep_inchar_2;
  wchar16 *local_7e8;
  XMLCh *actRetCanRep_2;
  undefined1 local_7d8 [4];
  Status myStatus_14;
  StrX local_7c8;
  char *local_7b8;
  char *actRetCanRep_inchar_1;
  wchar16 *local_7a0;
  XMLCh *actRetCanRep_1;
  undefined1 local_790 [4];
  Status myStatus_13;
  StrX local_780;
  char *local_770;
  char *actRetCanRep_inchar;
  wchar16 *local_758;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_738;
  StrX local_728;
  XSValue *local_718;
  XSValue *actRetValue_5;
  undefined1 local_708 [4];
  Status myStatus_11;
  StrX local_6f8;
  StrX local_6e8;
  XSValue *local_6d8;
  XSValue *actRetValue_4;
  undefined1 local_6c8 [4];
  Status myStatus_10;
  StrX local_6b8;
  StrX local_6a8;
  XSValue *local_698;
  XSValue *actRetValue_3;
  undefined1 local_688 [4];
  Status myStatus_9;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  StrX local_628;
  XSValue *local_618;
  XSValue *actRetValue_2;
  undefined1 local_608 [4];
  Status myStatus_8;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  StrX local_5a8;
  XSValue *local_598;
  XSValue *actRetValue_1;
  undefined1 local_588 [4];
  Status myStatus_7;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  StrX local_528;
  XSValue *local_518;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_4f8;
  StrX local_4e8;
  byte local_4d5;
  Status local_4d4;
  undefined1 local_4d0 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_4c0;
  StrX local_4b0;
  byte local_49d;
  Status local_49c;
  undefined1 local_498 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_488;
  StrX local_478;
  byte local_465;
  Status local_464;
  undefined1 local_460 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_450;
  byte local_43d;
  Status local_43c;
  undefined1 local_438 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_428;
  byte local_415;
  Status local_414;
  undefined1 local_410 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_3f0;
  byte local_3dd;
  Status local_3dc;
  char acStack_3d8 [3];
  bool actRetValid;
  Status myStatus;
  char r_c [17];
  char acStack_3b8 [8];
  char c_c [19];
  char acStack_398 [8];
  char r_b [17];
  char acStack_378 [8];
  char c_b [19];
  char acStack_358 [8];
  char r_a [17];
  char acStack_338 [8];
  char c_a [19];
  char acStack_318 [8];
  char r_9 [17];
  char acStack_2f8 [8];
  char c_9 [19];
  char local_2d8 [8];
  char r_8 [12];
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char c_8 [19];
  char acStack_2a8 [8];
  char r_7 [17];
  char acStack_288 [8];
  char c_7 [19];
  char acStack_268 [8];
  char r_6 [17];
  char acStack_248 [8];
  char c_6 [19];
  char acStack_228 [8];
  char r_5 [17];
  char acStack_208 [8];
  char c_5 [19];
  char acStack_1e8 [8];
  char r_4 [17];
  char acStack_1c8 [8];
  char c_4 [19];
  char local_1a8 [8];
  char r_3 [12];
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char c_3 [19];
  char local_178 [8];
  char r_2 [12];
  char c_2 [15];
  char r_1 [11];
  char c_1 [14];
  char cStack_132;
  char cStack_131;
  char v_3_canrep [18];
  char v_2_canrep [12];
  char v_1_canrep [11];
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [11];
  char iv_2 [11];
  char iv_1 [11];
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char v_3 [18];
  char local_38 [8];
  char v_2 [12];
  char cStack_24;
  char cStack_23;
  char cStack_22;
  char cStack_21;
  char v_1 [18];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(v_2 + 8,"   1",4);
  cStack_24 = '9';
  cStack_23 = '9';
  cStack_22 = '1';
  cStack_21 = '-';
  builtin_strncpy(local_38,"9999-06-",8);
  builtin_strncpy(v_2,"30Z",4);
  iv_1[8] = '9';
  iv_1[9] = '9';
  iv_1[10] = '9';
  cStack_55 = '9';
  cStack_54 = '1';
  cStack_53 = '-';
  cStack_52 = '0';
  cStack_51 = '7';
  stack0xffffffffffffff98 = 0x32312d30303032;
  stack0xffffffffffffff88 = 0x32302d31303032;
  act_v_ran_v_1.fValue._24_7_ = 0x36302d31303032;
  stack0xffffffffffffff7f = 0x31332d;
  stack0xfffffffffffffef0 = 0x35302d31393931;
  stack0xfffffffffffffee0 = 0x2d36302d39393939;
  v_2_canrep[0] = '3';
  v_2_canrep[1] = '0';
  v_2_canrep[2] = 'Z';
  v_2_canrep[3] = '\0';
  builtin_strncpy(c_1 + 8,"99991-",6);
  cStack_132 = '0';
  cStack_131 = '7';
  v_3_canrep[0] = '-';
  v_3_canrep[1] = '3';
  v_3_canrep[2] = '0';
  v_3_canrep[3] = '-';
  v_3_canrep[4] = '1';
  v_3_canrep[5] = '0';
  v_3_canrep[6] = ':';
  v_3_canrep[7] = '0';
  v_3_canrep[8] = '0';
  v_3_canrep[9] = '\0';
  builtin_strncpy(c_1,"-31  ",6);
  stack0xfffffffffffffeb8 = 0x2d3339393120;
  builtin_strncpy(c_2 + 8,"1993-05",7);
  builtin_strncpy(c_2,"-31Z  ",7);
  stack0xfffffffffffffe98 = 0x302d3339393120;
  builtin_strncpy(local_178,"1993-05-",8);
  r_2[0] = '3';
  r_2[1] = '1';
  r_2[2] = 'Z';
  r_2[3] = '\0';
  builtin_strncpy(r_3 + 8," 199",4);
  cStack_194 = '3';
  cStack_193 = '-';
  cStack_192 = '0';
  cStack_191 = '5';
  builtin_strncpy(local_1a8,"1993-05-",8);
  builtin_strncpy(r_3,"31Z",4);
  builtin_strncpy(acStack_1c8," 1993-05",8);
  builtin_strncpy(c_4,"-31+00:01 ",0xb);
  builtin_strncpy(acStack_1e8,"1993-05-",8);
  builtin_strncpy(r_4,"31+00:01",9);
  builtin_strncpy(acStack_208," 1993-05",8);
  builtin_strncpy(c_5,"-31+12:00 ",0xb);
  builtin_strncpy(acStack_228,"1993-05-",8);
  builtin_strncpy(r_5,"31+12:00",9);
  builtin_strncpy(acStack_248," 1994-01",8);
  builtin_strncpy(c_6,"-01+12:01 ",0xb);
  builtin_strncpy(acStack_268,"1993-12-",8);
  builtin_strncpy(r_6,"31-11:59",9);
  builtin_strncpy(acStack_288," 1994-01",8);
  builtin_strncpy(c_7,"-01+14:00 ",0xb);
  builtin_strncpy(acStack_2a8,"1993-12-",8);
  builtin_strncpy(r_7,"31-10:00",9);
  builtin_strncpy(r_8 + 8," 199",4);
  cStack_2c4 = '3';
  cStack_2c3 = '-';
  cStack_2c2 = '0';
  cStack_2c1 = '6';
  builtin_strncpy(local_2d8,"1993-06-",8);
  builtin_strncpy(r_8,"01Z",4);
  builtin_strncpy(acStack_2f8," 1993-06",8);
  builtin_strncpy(c_9,"-01-00:01 ",0xb);
  builtin_strncpy(acStack_318,"1993-06-",8);
  builtin_strncpy(r_9,"01-00:01",9);
  builtin_strncpy(acStack_338," 1993-06",8);
  builtin_strncpy(c_a,"-01-11:59 ",0xb);
  builtin_strncpy(acStack_358,"1993-06-",8);
  builtin_strncpy(r_a,"01-11:59",9);
  builtin_strncpy(acStack_378," 1993-05",8);
  builtin_strncpy(c_b,"-31-12:00 ",0xb);
  builtin_strncpy(acStack_398,"1993-06-",8);
  builtin_strncpy(r_b,"01+12:00",9);
  builtin_strncpy(acStack_3b8," 1993-05",8);
  builtin_strncpy(c_c,"-31-14:00 ",0xb);
  acStack_3d8[0] = '1';
  acStack_3d8[1] = '9';
  acStack_3d8[2] = '9';
  actRetValid = true;
  myStatus._0_1_ = '-';
  myStatus._1_1_ = '0';
  myStatus._2_1_ = '6';
  myStatus._3_1_ = '-';
  builtin_strncpy(r_c,"01+10:00",9);
  act_v_ran_v_1.f_datatype = 0x7c7;
  act_v_ran_v_1._4_4_ = 5;
  act_v_ran_v_1.fValue.f_int = 0x1f;
  act_v_ran_v_1.fValue.f_datetime.f_month = 0;
  act_v_ran_v_1.fValue.f_datetime.f_day = 0;
  act_v_ran_v_1.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_1.fValue._16_8_ = 0;
  act_v_ran_v_2.f_datatype = 9999;
  act_v_ran_v_2._4_4_ = 6;
  act_v_ran_v_2.fValue.f_int = 0x1e;
  act_v_ran_v_2.fValue.f_datetime.f_month = 0;
  act_v_ran_v_2.fValue.f_datetime.f_day = 0;
  act_v_ran_v_2.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_2.fValue._16_8_ = 0;
  act_v_ran_v_3.f_datatype = 0x18697;
  act_v_ran_v_3._4_4_ = 7;
  act_v_ran_v_3.fValue.f_int = 0x1e;
  act_v_ran_v_3.fValue.f_datetime.f_month = 0;
  act_v_ran_v_3.fValue.f_datetime.f_day = 0;
  act_v_ran_v_3.fValue.f_datetime.f_hour = 0;
  act_v_ran_v_3.fValue._16_8_ = 0;
  local_3dc = st_Init;
  StrX::StrX(&local_3f0,v_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_3f0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_date,&local_3dc,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_3f0);
  local_3dd = bVar1 & 1;
  if (local_3dd != 1) {
    pXVar3 = getDataTypeString(dt_date);
    StrX::StrX((StrX *)local_410,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_410);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xece,v_2 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_410);
    errSeen = true;
  }
  local_414 = st_Init;
  StrX::StrX(&local_428,local_38);
  pXVar3 = StrX::unicodeForm(&local_428);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_date,&local_414,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_428);
  local_415 = bVar1 & 1;
  if (local_415 != 1) {
    pXVar3 = getDataTypeString(dt_date);
    StrX::StrX((StrX *)local_438,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_438);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xecf,local_38,pcVar4,1);
    StrX::~StrX((StrX *)local_438);
    errSeen = true;
  }
  local_43c = st_Init;
  StrX::StrX(&local_450,iv_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_450);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_date,&local_43c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_450);
  local_43d = bVar1 & 1;
  if (local_43d != 1) {
    pXVar3 = getDataTypeString(dt_date);
    StrX::StrX((StrX *)local_460,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_460);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed0,iv_1 + 8,pcVar4,1);
    StrX::~StrX((StrX *)local_460);
    errSeen = true;
  }
  local_464 = st_Init;
  StrX::StrX(&local_478,iv_2 + 8);
  pXVar3 = StrX::unicodeForm(&local_478);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_date,&local_464,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_478);
  local_465 = bVar1 & 1;
  if (local_465 == 0) {
    if (local_464 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_498,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_498);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_464);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed3,iv_2 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_498);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_date);
    StrX::StrX(&local_488,pXVar3);
    pcVar4 = StrX::localForm(&local_488);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed3,iv_2 + 8,pcVar4,0);
    StrX::~StrX(&local_488);
    errSeen = true;
  }
  local_49c = st_Init;
  StrX::StrX(&local_4b0,iv_3 + 8);
  pXVar3 = StrX::unicodeForm(&local_4b0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_date,&local_49c,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_4b0);
  local_49d = bVar1 & 1;
  if (local_49d == 0) {
    if (local_49c != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_4d0,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_4d0);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_49c);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed4,iv_3 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_4d0);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_date);
    StrX::StrX(&local_4c0,pXVar3);
    pcVar4 = StrX::localForm(&local_4c0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed4,iv_3 + 8,pcVar4,0);
    StrX::~StrX(&local_4c0);
    errSeen = true;
  }
  local_4d4 = st_Init;
  StrX::StrX(&local_4e8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_4e8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_date,&local_4d4,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_4e8);
  local_4d5 = bVar1 & 1;
  if (local_4d5 == 0) {
    if (local_4d4 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)&myStatus_6,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_6);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_4d4);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xed5,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_6);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_date);
    StrX::StrX(&local_4f8,pXVar3);
    pcVar4 = StrX::localForm(&local_4f8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xed5,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,0);
    StrX::~StrX(&local_4f8);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_528,v_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_528);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_date,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_528);
    local_518 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_588,pXVar3);
      StrX::localForm((StrX *)local_588);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xeef,v_2 + 8);
      StrX::~StrX((StrX *)local_588);
      errSeen = true;
    }
    else {
      memcpy(&local_550,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_2.fValue + 0x18);
      memcpy(&local_578,pvVar10,0x28);
      actValue.fValue.f_long = uStack_548;
      actValue._0_8_ = local_550;
      actValue.fValue._8_8_ = local_540;
      actValue.fValue._16_8_ = uStack_538;
      actValue.fValue.f_datetime.f_milisec = (double)local_530;
      expValue.fValue.f_long = uStack_570;
      expValue._0_8_ = local_578;
      expValue.fValue._8_8_ = local_568;
      expValue.fValue._16_8_ = uStack_560;
      expValue.fValue.f_datetime.f_milisec = (double)local_558;
      bVar2 = compareActualValue(dt_date,actValue,expValue);
      pXVar5 = local_518;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_518 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_518);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_5a8,local_38);
    pXVar3 = StrX::unicodeForm(&local_5a8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_date,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5a8);
    local_598 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_608,pXVar3);
      StrX::localForm((StrX *)local_608);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef0,local_38);
      StrX::~StrX((StrX *)local_608);
      errSeen = true;
    }
    else {
      memcpy(&local_5d0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran_v_3.fValue + 0x18);
      memcpy(&local_5f8,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_5c8;
      actValue_00._0_8_ = local_5d0;
      actValue_00.fValue._8_8_ = local_5c0;
      actValue_00.fValue._16_8_ = uStack_5b8;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_5b0;
      expValue_00.fValue.f_long = uStack_5f0;
      expValue_00._0_8_ = local_5f8;
      expValue_00.fValue._8_8_ = local_5e8;
      expValue_00.fValue._16_8_ = uStack_5e0;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_5d8;
      bVar2 = compareActualValue(dt_date,actValue_00,expValue_00);
      pXVar5 = local_598;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_598 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_598);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_628,iv_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_628);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_date,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_628);
    local_618 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_688,pXVar3);
      StrX::localForm((StrX *)local_688);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef1,iv_1 + 8);
      StrX::~StrX((StrX *)local_688);
      errSeen = true;
    }
    else {
      memcpy(&local_650,pXVar5,0x28);
      pcVar4 = v_1_canrep + 8;
      memcpy(&local_678,pcVar4,0x28);
      actValue_01.fValue.f_long = uStack_648;
      actValue_01._0_8_ = local_650;
      actValue_01.fValue._8_8_ = local_640;
      actValue_01.fValue._16_8_ = uStack_638;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_630;
      expValue_01.fValue.f_long = uStack_670;
      expValue_01._0_8_ = local_678;
      expValue_01.fValue._8_8_ = local_668;
      expValue_01.fValue._16_8_ = uStack_660;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_658;
      bVar2 = compareActualValue(dt_date,actValue_01,expValue_01);
      pXVar5 = local_618;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_618 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_618);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pcVar4);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_6a8,iv_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_6a8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_date,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_6a8);
    local_698 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX((StrX *)local_6c8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_6c8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef4,iv_2 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_6c8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX(&local_6b8,pXVar3);
      StrX::localForm(&local_6b8);
      pvVar10 = (void *)0xef4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef4,iv_2 + 8);
      StrX::~StrX(&local_6b8);
      pXVar5 = local_698;
      errSeen = true;
      if (local_698 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_698);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_6e8,iv_3 + 8);
    pXVar3 = StrX::unicodeForm(&local_6e8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_date,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_6e8);
    local_6d8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX((StrX *)local_708,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_708);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef5,iv_3 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_708);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX(&local_6f8,pXVar3);
      StrX::localForm(&local_6f8);
      pvVar10 = (void *)0xef5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef5,iv_3 + 8);
      StrX::~StrX(&local_6f8);
      pXVar5 = local_6d8;
      errSeen = true;
      if (local_6d8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_6d8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_728,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_728);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_date,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_728);
    local_718 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX((StrX *)&myStatus_12,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_12);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xef6,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_12);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX(&local_738,pXVar3);
      StrX::localForm(&local_738);
      pvVar10 = (void *)0xef6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xef6,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_738);
      pXVar5 = local_718;
      errSeen = true;
      if (local_718 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_718);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,v_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_758 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_790,pXVar3);
      StrX::localForm((StrX *)local_790);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf12,v_2 + 8);
      StrX::~StrX((StrX *)local_790);
      errSeen = true;
    }
    else {
      local_770 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_770,v_2_canrep + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_780,pXVar3);
        pcVar4 = StrX::localForm(&local_780);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf12,v_2 + 8,pcVar4,local_770,v_2_canrep + 8);
        StrX::~StrX(&local_780);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_758);
      xercesc_4_0::XMLString::release(&local_770,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,local_38);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_7a0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_7d8,pXVar3);
      StrX::localForm((StrX *)local_7d8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf13,local_38);
      StrX::~StrX((StrX *)local_7d8);
      errSeen = true;
    }
    else {
      local_7b8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_7b8,v_3_canrep + 0x10);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_7c8,pXVar3);
        pcVar4 = StrX::localForm(&local_7c8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf13,local_38,pcVar4,local_7b8,v_3_canrep + 0x10);
        StrX::~StrX(&local_7c8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7a0);
      xercesc_4_0::XMLString::release(&local_7b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,iv_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_7e8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_820,pXVar3);
      StrX::localForm((StrX *)local_820);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf14,iv_1 + 8);
      StrX::~StrX((StrX *)local_820);
      errSeen = true;
    }
    else {
      local_800 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_800,c_1 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_810,pXVar3);
        pcVar4 = StrX::localForm(&local_810);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf14,iv_1 + 8,pcVar4,local_800,c_1 + 8);
        StrX::~StrX(&local_810);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7e8);
      xercesc_4_0::XMLString::release(&local_800,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,r_1 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_830 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_868,pXVar3);
      StrX::localForm((StrX *)local_868);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf16,r_1 + 8);
      StrX::~StrX((StrX *)local_868);
      errSeen = true;
    }
    else {
      local_848 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_848,c_2 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_858,pXVar3);
        pcVar4 = StrX::localForm(&local_858);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf16,r_1 + 8,pcVar4,local_848,c_2 + 8);
        StrX::~StrX(&local_858);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_830);
      xercesc_4_0::XMLString::release(&local_848,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_4,r_2 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
    local_878 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_8b0,pXVar3);
      StrX::localForm((StrX *)local_8b0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf17,r_2 + 8);
      StrX::~StrX((StrX *)local_8b0);
      errSeen = true;
    }
    else {
      local_890 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_890,local_178);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_8a0,pXVar3);
        pcVar4 = StrX::localForm(&local_8a0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf17,r_2 + 8,pcVar4,local_890,local_178);
        StrX::~StrX(&local_8a0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_878);
      xercesc_4_0::XMLString::release(&local_890,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_5._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_5,r_3 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
    local_8c0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_8f8,pXVar3);
      StrX::localForm((StrX *)local_8f8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf18,r_3 + 8);
      StrX::~StrX((StrX *)local_8f8);
      errSeen = true;
    }
    else {
      local_8d8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_8d8,local_1a8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_8e8,pXVar3);
        pcVar4 = StrX::localForm(&local_8e8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf18,r_3 + 8,pcVar4,local_8d8,local_1a8);
        StrX::~StrX(&local_8e8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_8c0);
      xercesc_4_0::XMLString::release(&local_8d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_6._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_6,acStack_1c8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_6);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_6);
    local_908 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_940,pXVar3);
      StrX::localForm((StrX *)local_940);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf19,acStack_1c8);
      StrX::~StrX((StrX *)local_940);
      errSeen = true;
    }
    else {
      local_920 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_920,acStack_1e8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_930,pXVar3);
        pcVar4 = StrX::localForm(&local_930);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf19,acStack_1c8,pcVar4,local_920,acStack_1e8);
        StrX::~StrX(&local_930);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_908);
      xercesc_4_0::XMLString::release(&local_920,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_7._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_7,acStack_208);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_7);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_7 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_7);
    local_950 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_988,pXVar3);
      StrX::localForm((StrX *)local_988);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1a,acStack_208);
      StrX::~StrX((StrX *)local_988);
      errSeen = true;
    }
    else {
      local_968 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_968,acStack_228);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_978,pXVar3);
        pcVar4 = StrX::localForm(&local_978);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1a,acStack_208,pcVar4,local_968,acStack_228);
        StrX::~StrX(&local_978);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_950);
      xercesc_4_0::XMLString::release(&local_968,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_8._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_8,acStack_248);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_8);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_8 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_8);
    local_998 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_9d0,pXVar3);
      StrX::localForm((StrX *)local_9d0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1b,acStack_248);
      StrX::~StrX((StrX *)local_9d0);
      errSeen = true;
    }
    else {
      local_9b0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_9b0,acStack_268);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_9c0,pXVar3);
        pcVar4 = StrX::localForm(&local_9c0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1b,acStack_248,pcVar4,local_9b0,acStack_268);
        StrX::~StrX(&local_9c0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_998);
      xercesc_4_0::XMLString::release(&local_9b0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_9._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_9,acStack_288);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_9);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_9 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_9);
    local_9e0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_a18,pXVar3);
      StrX::localForm((StrX *)local_a18);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1c,acStack_288);
      StrX::~StrX((StrX *)local_a18);
      errSeen = true;
    }
    else {
      local_9f8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_9f8,acStack_2a8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_a08,pXVar3);
        pcVar4 = StrX::localForm(&local_a08);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1c,acStack_288,pcVar4,local_9f8,acStack_2a8);
        StrX::~StrX(&local_a08);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_9e0);
      xercesc_4_0::XMLString::release(&local_9f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_10._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_10,r_8 + 8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_10);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_10 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_10);
    local_a28 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_a60,pXVar3);
      StrX::localForm((StrX *)local_a60);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1d,r_8 + 8);
      StrX::~StrX((StrX *)local_a60);
      errSeen = true;
    }
    else {
      local_a40 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_a40,local_2d8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_a50,pXVar3);
        pcVar4 = StrX::localForm(&local_a50);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1d,r_8 + 8,pcVar4,local_a40,local_2d8);
        StrX::~StrX(&local_a50);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_a28);
      xercesc_4_0::XMLString::release(&local_a40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_11._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_11,acStack_2f8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_11);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_11 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_11);
    local_a70 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_aa8,pXVar3);
      StrX::localForm((StrX *)local_aa8);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1e,acStack_2f8);
      StrX::~StrX((StrX *)local_aa8);
      errSeen = true;
    }
    else {
      local_a88 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_a88,acStack_318);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_a98,pXVar3);
        pcVar4 = StrX::localForm(&local_a98);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1e,acStack_2f8,pcVar4,local_a88,acStack_318);
        StrX::~StrX(&local_a98);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_a70);
      xercesc_4_0::XMLString::release(&local_a88,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_12._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_12,acStack_338);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_12);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_12 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_12);
    local_ab8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_af0,pXVar3);
      StrX::localForm((StrX *)local_af0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf1f,acStack_338);
      StrX::~StrX((StrX *)local_af0);
      errSeen = true;
    }
    else {
      local_ad0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_ad0,acStack_358);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_ae0,pXVar3);
        pcVar4 = StrX::localForm(&local_ae0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf1f,acStack_338,pcVar4,local_ad0,acStack_358);
        StrX::~StrX(&local_ae0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_ab8);
      xercesc_4_0::XMLString::release(&local_ad0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_13._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_13,acStack_378);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_13);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_13 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_13);
    local_b00 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_b38,pXVar3);
      StrX::localForm((StrX *)local_b38);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf20,acStack_378);
      StrX::~StrX((StrX *)local_b38);
      errSeen = true;
    }
    else {
      local_b18 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_b18,acStack_398);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_b28,pXVar3);
        pcVar4 = StrX::localForm(&local_b28);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf20,acStack_378,pcVar4,local_b18,acStack_398);
        StrX::~StrX(&local_b28);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b00);
      xercesc_4_0::XMLString::release(&local_b18,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_14._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_14,acStack_3b8);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_14);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_date,(Status *)((long)&actRetCanRep_14 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_14);
    local_b48 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX((StrX *)local_b80,pXVar3);
      StrX::localForm((StrX *)local_b80);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf21,acStack_3b8);
      StrX::~StrX((StrX *)local_b80);
      errSeen = true;
    }
    else {
      local_b60 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_b60,acStack_3d8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_b70,pXVar3);
        pcVar4 = StrX::localForm(&local_b70);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xf21,acStack_3b8,pcVar4,local_b60,acStack_3d8);
        StrX::~StrX(&local_b70);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b48);
      xercesc_4_0::XMLString::release(&local_b60,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_15._4_4_ = st_Init;
    StrX::StrX(&local_ba0,iv_2 + 8);
    pXVar3 = StrX::unicodeForm(&local_ba0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_date,(Status *)((long)&actRetCanRep_15 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_ba0);
    local_b90 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_15._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX((StrX *)local_bc0,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_bc0);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_15._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf24,iv_2 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_bc0);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX(&local_bb0,pXVar3);
      StrX::localForm(&local_bb0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf24,iv_2 + 8);
      StrX::~StrX(&local_bb0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_b90);
      errSeen = true;
    }
    actRetCanRep_16._4_4_ = st_Init;
    StrX::StrX(&local_be0,iv_3 + 8);
    pXVar3 = StrX::unicodeForm(&local_be0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_date,(Status *)((long)&actRetCanRep_16 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_be0);
    local_bd0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_16._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX((StrX *)local_c00,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_c00);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_16._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf25,iv_3 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_c00);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX(&local_bf0,pXVar3);
      StrX::localForm(&local_bf0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf25,iv_3 + 8);
      StrX::~StrX(&local_bf0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_bd0);
      errSeen = true;
    }
    actRetCanRep_17._4_4_ = st_Init;
    StrX::StrX(&local_c20,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_c20);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_date,(Status *)((long)&actRetCanRep_17 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_c20);
    local_c10 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_17._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_date);
        StrX::StrX(&local_c40,pXVar3);
        pcVar4 = StrX::localForm(&local_c40);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_17._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xf26,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX(&local_c40);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_date);
      StrX::StrX(&local_c30,pXVar3);
      StrX::localForm(&local_c30);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xf26,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_c30);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_c10);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_date()
{
    const XSValue::DataType dt = XSValue::dt_date;
    bool  toValidate = true;

    const char v_1[]="   1991-05-31   \n";
    const char v_2[]="9999-06-30Z";
    const char v_3[]="99991-07-31+14:00";

    const char iv_1[]="2000-12-32";
    const char iv_2[]="2001-02-29";
    const char iv_3[]="2001-06-31";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="1991-05-31";
    const char v_2_canrep[]="9999-06-30Z";
    const char v_3_canrep[]="99991-07-30-10:00";

    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */

    const char c_1[] = " 1993-05-31  ";       const char r_1[] = "1993-05-31";
    const char c_2[] = " 1993-05-31Z  ";      const char r_2[] = "1993-05-31Z";
    const char c_3[] = " 1993-05-31+00:00 ";  const char r_3[] = "1993-05-31Z";
    const char c_4[] = " 1993-05-31+00:01 ";  const char r_4[] = "1993-05-31+00:01";
    const char c_5[] = " 1993-05-31+12:00 ";  const char r_5[] = "1993-05-31+12:00";
    const char c_6[] = " 1994-01-01+12:01 ";  const char r_6[] = "1993-12-31-11:59";
    const char c_7[] = " 1994-01-01+14:00 ";  const char r_7[] = "1993-12-31-10:00";
    const char c_8[] = " 1993-06-01-00:00 ";  const char r_8[] = "1993-06-01Z";
    const char c_9[] = " 1993-06-01-00:01 ";  const char r_9[] = "1993-06-01-00:01";
    const char c_a[] = " 1993-06-01-11:59 ";  const char r_a[] = "1993-06-01-11:59";
    const char c_b[] = " 1993-05-31-12:00 ";  const char r_b[] = "1993-06-01+12:00";
    const char c_c[] = " 1993-05-31-14:00 ";  const char r_c[] = "1993-06-01+10:00";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 1991;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 05;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 9999;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 06;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 99991;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 07;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        CANREP_TEST(c_1,  dt, toValidate, EXP_RET_CANREP_TRUE, r_1, DONT_CARE);
        CANREP_TEST(c_2,  dt, toValidate, EXP_RET_CANREP_TRUE, r_2, DONT_CARE);
        CANREP_TEST(c_3,  dt, toValidate, EXP_RET_CANREP_TRUE, r_3, DONT_CARE);
        CANREP_TEST(c_4,  dt, toValidate, EXP_RET_CANREP_TRUE, r_4, DONT_CARE);
        CANREP_TEST(c_5,  dt, toValidate, EXP_RET_CANREP_TRUE, r_5, DONT_CARE);
        CANREP_TEST(c_6,  dt, toValidate, EXP_RET_CANREP_TRUE, r_6, DONT_CARE);
        CANREP_TEST(c_7,  dt, toValidate, EXP_RET_CANREP_TRUE, r_7, DONT_CARE);
        CANREP_TEST(c_8,  dt, toValidate, EXP_RET_CANREP_TRUE, r_8, DONT_CARE);
        CANREP_TEST(c_9,  dt, toValidate, EXP_RET_CANREP_TRUE, r_9, DONT_CARE);
        CANREP_TEST(c_a,  dt, toValidate, EXP_RET_CANREP_TRUE, r_a, DONT_CARE);
        CANREP_TEST(c_b,  dt, toValidate, EXP_RET_CANREP_TRUE, r_b, DONT_CARE);
        CANREP_TEST(c_c,  dt, toValidate, EXP_RET_CANREP_TRUE, r_c, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);

    }

}